

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryVectors
          (PlanningUnitMADPDiscrete *this,LIndex jaohI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jaIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *joIs)

{
  pointer puVar1;
  iterator iVar2;
  Index t;
  JointActionObservationHistoryTree *this_00;
  JointActionObservationHistory *this_01;
  ulong uVar3;
  Index *joIs_00;
  Index *__args;
  ulong uVar4;
  uint *jaIs_00;
  Index aIStack_50 [4];
  undefined1 *local_40;
  Index local_34;
  
  puVar1 = (jaIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((jaIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (jaIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  puVar1 = (joIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((joIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (joIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  aIStack_50[0] = 0x40644e;
  aIStack_50[1] = 0;
  this_00 = GetJointActionObservationHistoryTree(this,jaohI);
  if (this_00 != (JointActionObservationHistoryTree *)0x0) {
    aIStack_50[0] = 0x40645b;
    aIStack_50[1] = 0;
    this_01 = JointActionObservationHistoryTree::GetJointActionObservationHistory(this_00);
    JointActionObservationHistory::GetJointActionObservationHistoryVectors(this_01,jaIs,joIs);
    return;
  }
  aIStack_50[0] = 0x406482;
  aIStack_50[1] = 0;
  t = GetTimeStepForJAOHI(this,jaohI);
  uVar4 = (ulong)t;
  uVar3 = uVar4 * 4 + 0xf & 0xfffffffffffffff0;
  jaIs_00 = (uint *)((long)aIStack_50 + (8 - uVar3));
  joIs_00 = (Index *)((long)jaIs_00 - uVar3);
  local_40 = (undefined1 *)(aIStack_50 + 2);
  local_34 = t;
  joIs_00[-2] = 0x4064bd;
  joIs_00[-1] = 0;
  GetJointActionObservationHistoryArrays(this,jaohI,t,jaIs_00,joIs_00);
  __args = joIs_00;
  if (local_34 != 0) {
    do {
      iVar2._M_current =
           (jaIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (jaIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        joIs_00[-2] = 0x4064e7;
        joIs_00[-1] = 0;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)jaIs,iVar2,jaIs_00);
      }
      else {
        *iVar2._M_current = *jaIs_00;
        (jaIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar2._M_current =
           (joIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (joIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        joIs_00[-2] = 0x40650c;
        joIs_00[-1] = 0;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)joIs,iVar2,__args);
      }
      else {
        *iVar2._M_current = *__args;
        (joIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      __args = __args + 1;
      jaIs_00 = jaIs_00 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryVectors
    (LIndex jaohI, vector<Index> &jaIs, vector<Index> &joIs) const
{
    jaIs.clear();
    joIs.clear();

    JointActionObservationHistoryTree* jaoht = 
        GetJointActionObservationHistoryTree(jaohI);
    // if it is not cached, jaoht will be set to 0
    if(jaoht)
    {
        jaoht->GetJointActionObservationHistory()->
            GetJointActionObservationHistoryVectors(jaIs, joIs);
    }
    else
    {    
        Index t = GetTimeStepForJAOHI(jaohI);
        Index jaIs_arr[t];
        Index joIs_arr[t];
        GetJointActionObservationHistoryArrays(jaohI, t, jaIs_arr, joIs_arr );
        for(size_t t2 = 0; t2 < t; t2++)
        {
            jaIs.push_back(jaIs_arr[t2]);
            joIs.push_back(joIs_arr[t2]);
        }
    }
}